

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O2

uint32 base_size(uint32 entries,uint32 max_vocab,uint8 remaining_bits)

{
  uint8 uVar1;
  
  uVar1 = bitarr_required_bits(max_vocab);
  return ((uint)(byte)(uVar1 + remaining_bits) * (entries + 1) + 7 >> 3) + 8;
}

Assistant:

static uint32
base_size(uint32 entries, uint32 max_vocab, uint8 remaining_bits)
{
    uint8 total_bits = bitarr_required_bits(max_vocab) + remaining_bits;
    /* Extra entry for next pointer at the end.  
     * +7 then / 8 to round up bits and convert to bytes
     * +sizeof(uint64) so that ReadInt57 etc don't go segfault.  
     * Note that this waste is O(order), not O(number of ngrams).*/
    return ((1 + entries) * total_bits + 7) / 8 + sizeof(uint64);
}